

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pssw.c
# Opt level: O0

parasail_result_ssw_t *
parasail_ssw_profile(parasail_profile_t *profile,char *s2,int s2Len_,int open,int gap)

{
  char *s;
  parasail_matrix_t *matrix_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int s2Len_00;
  int iVar4;
  char *s1_00;
  char *s2_00;
  parasail_cigar_t *__ptr;
  bool bVar5;
  bool bVar6;
  parasail_cigar_t *cigar;
  int s2Off;
  int s1Off;
  int s2Len;
  int s1Len;
  char *s2_reverse;
  char *s1_reverse;
  int has16;
  int has8;
  parasail_result_ssw_t *result_ssw;
  parasail_result_t *result_final;
  parasail_result_t *result_reverse;
  parasail_result_t *result_forward;
  parasail_matrix_t *matrix;
  char *s1;
  int gap_local;
  int open_local;
  int s2Len__local;
  char *s2_local;
  parasail_profile_t *profile_local;
  
  s = profile->s1;
  matrix_00 = profile->matrix;
  result_reverse = (parasail_result_t *)0x0;
  result_final = (parasail_result_t *)0x0;
  result_ssw = (parasail_result_ssw_t *)0x0;
  bVar5 = (profile->profile8).score != (void *)0x0;
  bVar6 = (profile->profile16).score != (void *)0x0;
  if (bVar5) {
    result_reverse = parasail_sw_striped_profile_8(profile,s2,s2Len_,open,gap);
    iVar1 = parasail_result_is_saturated(result_reverse);
    if (iVar1 != 0) {
      parasail_result_free(result_reverse);
      result_reverse = (parasail_result_t *)0x0;
    }
    bVar5 = iVar1 == 0 && bVar5;
  }
  if ((result_reverse == (parasail_result_t *)0x0) && (bVar6)) {
    result_reverse = parasail_sw_striped_profile_16(profile,s2,s2Len_,open,gap);
    iVar1 = parasail_result_is_saturated(result_reverse);
    if (iVar1 != 0) {
      parasail_result_free(result_reverse);
      result_reverse = (parasail_result_t *)0x0;
    }
  }
  if (result_reverse == (parasail_result_t *)0x0) {
    profile_local = (parasail_profile_t *)0x0;
  }
  else {
    iVar1 = result_reverse->end_query + 1;
    iVar2 = result_reverse->end_ref + 1;
    s1_00 = parasail_reverse(s,(long)iVar1);
    s2_00 = parasail_reverse(s2,(long)iVar2);
    if (bVar5) {
      result_final = parasail_sw_striped_8(s1_00,iVar1,s2_00,iVar2,open,gap,matrix_00);
      iVar3 = parasail_result_is_saturated(result_final);
      if (iVar3 != 0) {
        bVar5 = false;
        parasail_result_free(result_final);
        result_final = (parasail_result_t *)0x0;
      }
    }
    if ((result_final == (parasail_result_t *)0x0) && (bVar6)) {
      result_final = parasail_sw_striped_16(s1_00,iVar1,s2_00,iVar2,open,gap,matrix_00);
      iVar1 = parasail_result_is_saturated(result_final);
      if (iVar1 != 0) {
        parasail_result_free(result_final);
        result_final = (parasail_result_t *)0x0;
      }
    }
    free(s2_00);
    free(s1_00);
    if (result_final == (parasail_result_t *)0x0) {
      parasail_result_free(result_reverse);
      profile_local = (parasail_profile_t *)0x0;
    }
    else {
      iVar1 = result_reverse->end_query - result_final->end_query;
      iVar2 = result_reverse->end_ref - result_final->end_ref;
      iVar3 = result_final->end_query + 1;
      s2Len_00 = result_final->end_ref + 1;
      if (bVar5) {
        result_ssw = (parasail_result_ssw_t *)
                     parasail_sw_trace_striped_8
                               (s + iVar1,iVar3,s2 + iVar2,s2Len_00,open,gap,matrix_00);
        iVar4 = parasail_result_is_saturated((parasail_result_t *)result_ssw);
        if (iVar4 != 0) {
          parasail_result_free((parasail_result_t *)result_ssw);
          result_ssw = (parasail_result_ssw_t *)0x0;
        }
      }
      if ((result_ssw == (parasail_result_ssw_t *)0x0) && (bVar6)) {
        result_ssw = (parasail_result_ssw_t *)
                     parasail_sw_trace_striped_16
                               (s + iVar1,iVar3,s2 + iVar2,s2Len_00,open,gap,matrix_00);
        iVar4 = parasail_result_is_saturated((parasail_result_t *)result_ssw);
        if (iVar4 != 0) {
          parasail_result_free((parasail_result_t *)result_ssw);
          result_ssw = (parasail_result_ssw_t *)0x0;
        }
      }
      if (result_ssw == (parasail_result_ssw_t *)0x0) {
        parasail_result_free(result_final);
        parasail_result_free(result_reverse);
        profile_local = (parasail_profile_t *)0x0;
      }
      else {
        __ptr = parasail_result_get_cigar
                          ((parasail_result_t *)result_ssw,s + iVar1,iVar3,s2 + iVar2,s2Len_00,
                           matrix_00);
        profile_local = (parasail_profile_t *)malloc(0x28);
        *(short *)&profile_local->s1 = (short)result_reverse->score;
        *(int *)((long)&profile_local->s1 + 4) = iVar2;
        profile_local->s1Len = result_reverse->end_ref;
        *(int *)&profile_local->field_0xc = iVar1;
        *(int *)&profile_local->matrix = result_reverse->end_query;
        (profile_local->profile8).score = __ptr->seq;
        *(int *)&(profile_local->profile8).matches = __ptr->len;
        free(__ptr);
        parasail_result_free((parasail_result_t *)result_ssw);
        parasail_result_free(result_final);
        parasail_result_free(result_reverse);
      }
    }
  }
  return (parasail_result_ssw_t *)profile_local;
}

Assistant:

parasail_result_ssw_t* parasail_ssw_profile(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len_,
        const int open, const int gap)
{
    const char *s1 = profile->s1;
    const parasail_matrix_t *matrix = profile->matrix;
    parasail_result_t *result_forward = NULL;
    parasail_result_t *result_reverse = NULL;
    parasail_result_t *result_final = NULL;
    parasail_result_ssw_t *result_ssw = NULL;
    int has8 = 0;
    int has16 = 0;
    char *s1_reverse = NULL;
    char *s2_reverse = NULL;
    int s1Len = 0;
    int s2Len = 0;
    int s1Off = 0;
    int s2Off = 0;
    parasail_cigar_t *cigar = NULL;

    /* find the end loc first with the faster implementation */
    has8 = (NULL != profile->profile8.score);
    has16 = (NULL != profile->profile16.score);

    /* find the end loc first with the faster implementation */
    if (has8) {
        result_forward = parasail_sw_striped_profile_8(profile, s2, s2Len_, open, gap);
        if (parasail_result_is_saturated(result_forward)) {
            has8 = 0;
            parasail_result_free(result_forward);
            result_forward = NULL;
        }
    }
    if (NULL == result_forward && has16) {
        result_forward = parasail_sw_striped_profile_16(profile, s2, s2Len_, open, gap);
        if (parasail_result_is_saturated(result_forward)) {
            parasail_result_free(result_forward);
            result_forward = NULL;
        }
    }
    /* 8- and/or 16-bit options could fail */
    if (NULL == result_forward) {
        return NULL;
    }

    /* find beginning loc by going in reverse */
    s1Len = result_forward->end_query+1;
    s2Len = result_forward->end_ref+1;
    s1_reverse = parasail_reverse(s1, s1Len);
    s2_reverse = parasail_reverse(s2, s2Len);
    if (has8) {
        result_reverse = parasail_sw_striped_8(
                s1_reverse, s1Len,
                s2_reverse, s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_reverse)) {
            has8 = 0;
            parasail_result_free(result_reverse);
            result_reverse = NULL;
        }
    }
    if (NULL == result_reverse && has16) {
        result_reverse = parasail_sw_striped_16(
                s1_reverse, s1Len,
                s2_reverse, s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_reverse)) {
            parasail_result_free(result_reverse);
            result_reverse = NULL;
        }
    }
    free(s2_reverse);
    free(s1_reverse);

    /* 8- and/or 16-bit options could fail */
    if (NULL == result_reverse) {
        parasail_result_free(result_forward); /* free the forward result */
        return NULL;
    }

    /* run trace version of sw on just the aligned portion */
    s1Off = result_forward->end_query - result_reverse->end_query;
    s2Off = result_forward->end_ref - result_reverse->end_ref;
    s1Len = result_reverse->end_query+1;
    s2Len = result_reverse->end_ref+1;
    if (has8) {
        result_final = parasail_sw_trace_striped_8(
                &s1[s1Off], s1Len,
                &s2[s2Off], s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_final)) {
            has8 = 0;
            parasail_result_free(result_final);
            result_final = NULL;
        }
    }
    if (NULL == result_final && has16) {
        result_final = parasail_sw_trace_striped_16(
                &s1[s1Off], s1Len,
                &s2[s2Off], s2Len,
                open, gap, matrix);
        if (parasail_result_is_saturated(result_final)) {
            parasail_result_free(result_final);
            result_final = NULL;
        }
    }

    /* 8- and/or 16-bit options could fail */
    if (NULL == result_final) {
        parasail_result_free(result_reverse); /* free reverse result */
        parasail_result_free(result_forward); /* free forward result */
        return NULL;
    }

    /* get cigar from traceback */
    cigar = parasail_result_get_cigar(result_final,
            &s1[s1Off], s1Len,
            &s2[s2Off], s2Len,
            matrix);

    result_ssw = (parasail_result_ssw_t*)malloc(sizeof(parasail_result_ssw_t));
    result_ssw->score1 = result_forward->score;
    result_ssw->ref_begin1 = s2Off;
    result_ssw->ref_end1 = result_forward->end_ref;
    result_ssw->read_begin1 = s1Off;
    result_ssw->read_end1 = result_forward->end_query;
    result_ssw->cigar = cigar->seq;
    result_ssw->cigarLen = cigar->len;

    free(cigar);
    parasail_result_free(result_final);
    parasail_result_free(result_reverse);
    parasail_result_free(result_forward);

    return result_ssw;;
}